

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O1

void __thiscall SQCompiler::IfStatement(SQCompiler *this)

{
  SQFuncState *this_00;
  SQUnsignedInteger SVar1;
  long lVar2;
  SQUnsignedInteger SVar3;
  SQUnsignedInteger SVar4;
  SQInteger SVar5;
  SQInstruction local_38;
  
  SVar5 = SQLexer::Lex(&this->_lex);
  this->_token = SVar5;
  Expect(this,0x28);
  CommaExpr(this);
  Expect(this,0x29);
  this_00 = this->_fs;
  SVar5 = SQFuncState::PopTarget(this_00);
  local_38._arg0 = (uchar)SVar5;
  local_38._0_5_ = 0x1e00000000;
  local_38 = (SQInstruction)((ulong)local_38._4_2_ << 0x20);
  SQFuncState::AddInstruction(this_00,&local_38);
  SVar1 = (this->_fs->_instructions)._size;
  IfBlock(this);
  lVar2 = this->_token;
  SVar3 = (this->_fs->_instructions)._size;
  if (lVar2 == 0x111) {
    local_38._arg1 = 0;
    local_38.op = '\x1c';
    local_38._arg0 = '\0';
    local_38._arg2 = '\0';
    local_38._arg3 = '\0';
    SQFuncState::AddInstruction(this->_fs,&local_38);
    SVar4 = (this->_fs->_instructions)._size;
    SVar5 = SQLexer::Lex(&this->_lex);
    this->_token = SVar5;
    IfBlock(this);
    SQFuncState::SetInstructionParam(this->_fs,SVar4 - 1,1,(this->_fs->_instructions)._size - SVar4)
    ;
  }
  SQFuncState::SetInstructionParam(this->_fs,SVar1 - 1,1,(ulong)(lVar2 == 0x111) + (SVar3 - SVar1));
  return;
}

Assistant:

void IfStatement()
    {
        SQInteger jmppos;
        bool haselse = false;
        Lex(); Expect(_SC('(')); CommaExpr(); Expect(_SC(')'));
        _fs->AddInstruction(_OP_JZ, _fs->PopTarget());
        SQInteger jnepos = _fs->GetCurrentPos();



        IfBlock();
        //
        /*static int n = 0;
        if (_token != _SC('}') && _token != TK_ELSE) {
            printf("IF %d-----------------------!!!!!!!!!\n", n);
            if (n == 5)
            {
                printf("asd");
            }
            n++;
            //OptionalSemicolon();
        }*/


        SQInteger endifblock = _fs->GetCurrentPos();
        if(_token == TK_ELSE){
            haselse = true;
            //BEGIN_SCOPE();
            _fs->AddInstruction(_OP_JMP);
            jmppos = _fs->GetCurrentPos();
            Lex();
            //Statement(); if(_lex._prevtoken != _SC('}')) OptionalSemicolon();
            IfBlock();
            //END_SCOPE();
            _fs->SetInstructionParam(jmppos, 1, _fs->GetCurrentPos() - jmppos);
        }
        _fs->SetInstructionParam(jnepos, 1, endifblock - jnepos + (haselse?1:0));
    }